

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::StringMaker<std::chrono::duration<long,std::ratio<1l,1l>>,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,
          StringMaker<std::chrono::duration<long,std::ratio<1l,1l>>,void> *this,
          duration<long,_std::ratio<1L,_1L>_> *duration)

{
  ReusableStringStream *this_00;
  rep local_38;
  undefined1 local_30 [8];
  ReusableStringStream rss;
  duration<long,_std::ratio<1L,_1L>_> *duration_local;
  
  rss.m_oss = (ostream *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_30);
  local_38 = clara::std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                       ((duration<long,_std::ratio<1L,_1L>_> *)rss.m_oss);
  this_00 = ReusableStringStream::operator<<((ReusableStringStream *)local_30,&local_38);
  ReusableStringStream::operator<<(this_00,(char (*) [3])" s");
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_30);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(std::chrono::duration<Value, std::ratio<1>> const& duration) {
            ReusableStringStream rss;
            rss << duration.count() << " s";
            return rss.str();
        }